

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# text_format.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_19::FieldValuePrinterWrapper::PrintMessageEnd
          (FieldValuePrinterWrapper *this,Message *message,int field_index,int field_count,
          bool single_line_mode,BaseTextGenerator *generator)

{
  pointer pFVar1;
  string local_50;
  BaseTextGenerator *local_30;
  BaseTextGenerator *generator_local;
  uint local_20;
  uint uStack_1c;
  bool single_line_mode_local;
  int field_count_local;
  int field_index_local;
  Message *message_local;
  FieldValuePrinterWrapper *this_local;
  
  local_30 = generator;
  generator_local._7_1_ = single_line_mode;
  local_20 = field_count;
  uStack_1c = field_index;
  _field_count_local = message;
  message_local = (Message *)this;
  pFVar1 = std::
           unique_ptr<const_google::protobuf::TextFormat::FieldValuePrinter,_std::default_delete<const_google::protobuf::TextFormat::FieldValuePrinter>_>
           ::operator->(&this->delegate_);
  (*pFVar1->_vptr_FieldValuePrinter[0xe])
            (&local_50,pFVar1,_field_count_local,(ulong)uStack_1c,(ulong)local_20,
             (ulong)(generator_local._7_1_ & 1));
  TextFormat::BaseTextGenerator::PrintString(generator,&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void PrintMessageEnd(
      const Message& message, int field_index, int field_count,
      bool single_line_mode,
      TextFormat::BaseTextGenerator* generator) const override {
    generator->PrintString(delegate_->PrintMessageEnd(
        message, field_index, field_count, single_line_mode));
  }